

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

altsvc * altsvc_create(Curl_str *srchost,Curl_str *dsthost,Curl_str *srcalpn,Curl_str *dstalpn,
                      size_t srcport,size_t dstport)

{
  alpnid dstalpnid_00;
  alpnid srcalpnid_00;
  alpnid srcalpnid;
  alpnid dstalpnid;
  size_t dstport_local;
  size_t srcport_local;
  Curl_str *dstalpn_local;
  Curl_str *srcalpn_local;
  Curl_str *dsthost_local;
  Curl_str *srchost_local;
  
  dstalpnid_00 = Curl_alpn2alpnid(dstalpn->str,dstalpn->len);
  srcalpnid_00 = Curl_alpn2alpnid(srcalpn->str,srcalpn->len);
  if ((srcalpnid_00 == ALPN_none) || (dstalpnid_00 == ALPN_none)) {
    srchost_local = (Curl_str *)0x0;
  }
  else {
    srchost_local =
         (Curl_str *)
         altsvc_createid(srchost->str,srchost->len,dsthost->str,dsthost->len,srcalpnid_00,
                         dstalpnid_00,srcport,dstport);
  }
  return (altsvc *)srchost_local;
}

Assistant:

static struct altsvc *altsvc_create(struct Curl_str *srchost,
                                    struct Curl_str *dsthost,
                                    struct Curl_str *srcalpn,
                                    struct Curl_str *dstalpn,
                                    size_t srcport,
                                    size_t dstport)
{
  enum alpnid dstalpnid =
    Curl_alpn2alpnid(Curl_str(dstalpn), Curl_strlen(dstalpn));
  enum alpnid srcalpnid =
    Curl_alpn2alpnid(Curl_str(srcalpn), Curl_strlen(srcalpn));
  if(!srcalpnid || !dstalpnid)
    return NULL;
  return altsvc_createid(Curl_str(srchost), Curl_strlen(srchost),
                         Curl_str(dsthost), Curl_strlen(dsthost),
                         srcalpnid, dstalpnid,
                         srcport, dstport);
}